

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O0

int __thiscall
VMFrameStack::Call(VMFrameStack *this,VMFunction *func,VMValue *params,int numparams,
                  VMReturn *results,int numresults,VMException **trap)

{
  VMFrame *callee;
  VMException *exception;
  int numret;
  bool allocated;
  int numresults_local;
  VMReturn *results_local;
  int numparams_local;
  VMValue *params_local;
  VMFunction *func_local;
  VMFrameStack *this_local;
  
  if (((func->super_DObject).field_0x24 & 1) == 0) {
    AllocFrame(this,(VMScriptFunction *)func);
    callee = TopFrame(this);
    VMFillParams(params,callee,numparams);
    this_local._4_4_ =
         (*VMExec)(this,(VMOP *)func[1].super_DObject._vptr_DObject,results,numresults);
    PopFrame(this);
  }
  else {
    this_local._4_4_ =
         (*(code *)func[1].super_DObject._vptr_DObject)(this,params,numparams,results,numresults);
  }
  return this_local._4_4_;
}

Assistant:

int VMFrameStack::Call(VMFunction *func, VMValue *params, int numparams, VMReturn *results, int numresults, VMException **trap)
{
	bool allocated = false;
	try
	{
		if (func->Native)
		{
			return static_cast<VMNativeFunction *>(func)->NativeCall(this, params, numparams, results, numresults);
		}
		else
		{
			AllocFrame(static_cast<VMScriptFunction *>(func));
			allocated = true;
			VMFillParams(params, TopFrame(), numparams);
			int numret = VMExec(this, static_cast<VMScriptFunction *>(func)->Code, results, numresults);
			PopFrame();
			return numret;
		}
	}
	catch (VMException *exception)
	{
		if (allocated)
		{
			PopFrame();
		}
		if (trap != NULL)
		{
			*trap = exception;
			return -1;
		}
		throw;
	}
	catch (...)
	{
		if (allocated)
		{
			PopFrame();
		}
		throw;
	}
}